

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard.c
# Opt level: O0

void cod_process_include(char *name,cod_parse_context context)

{
  int iVar1;
  char *pcVar2;
  cod_extern_list in_RDI;
  intptr_t char_count;
  size_t local_18;
  
  pcVar2 = strchr((char *)in_RDI,0x2e);
  local_18 = (long)pcVar2 - (long)in_RDI;
  if ((long)local_18 < 0) {
    local_18 = strlen((char *)in_RDI);
  }
  iVar1 = strncmp((char *)in_RDI,"string",local_18);
  if (iVar1 == 0) {
    cod_assoc_externs((cod_parse_context)char_count,in_RDI);
    cod_parse_for_context((char *)context,(cod_parse_context)char_count);
  }
  else {
    iVar1 = strncmp((char *)in_RDI,"math",local_18);
    if (iVar1 == 0) {
      dlload_externs("libm",math_externs);
      cod_assoc_externs((cod_parse_context)char_count,in_RDI);
      cod_parse_for_context((char *)context,(cod_parse_context)char_count);
    }
    else {
      iVar1 = strncmp((char *)in_RDI,"limits",local_18);
      if (iVar1 == 0) {
        cod_parse_for_context((char *)context,(cod_parse_context)char_count);
      }
    }
  }
  return;
}

Assistant:

extern void
cod_process_include(char *name, cod_parse_context context)
{
    intptr_t char_count = strchr(name, '.') - name;
    if (char_count < 0) char_count = strlen(name);
    if (strncmp(name, "string", char_count) == 0) {
	cod_assoc_externs(context, string_externs);
	cod_parse_for_context(string_extern_string, context);
    } else if (strncmp(name, "math", char_count) == 0) {
	dlload_externs("libm", math_externs);
	cod_assoc_externs(context, math_externs);
	cod_parse_for_context(math_extern_string, context);
    } else if (strncmp(name, "limits", char_count) == 0) {
	cod_parse_for_context(limits_extern_string, context);
    }

}